

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

void __thiscall Fad<Fad<double>_>::Fad(Fad<Fad<double>_> *this,int sz,Fad<double> *x)

{
  undefined4 in_ESI;
  Fad<double> *in_RDI;
  Fad<double> *in_stack_00000020;
  int in_stack_0000002c;
  Vector<Fad<double>_> *in_stack_00000030;
  Fad<double> *this_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  
  FadSuper::FadSuper((FadSuper *)in_RDI);
  Fad<double>::Fad(in_RDI,(Fad<double> *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_00 = (Fad<double> *)&in_RDI[1].dx_;
  Fad<double>::Fad<int,_nullptr>(in_RDI,(int *)CONCAT44(in_ESI,in_stack_ffffffffffffff98));
  Vector<Fad<double>_>::Vector(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  Fad<double>::~Fad(this_00);
  Fad<double>::Fad<int,_nullptr>(in_RDI,(int *)CONCAT44(in_ESI,in_stack_ffffffffffffff98));
  return;
}

Assistant:

Fad(const int sz, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0)) {;}